

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  REF_INT *pRVar7;
  uint uVar8;
  int iVar9;
  REF_STATUS RVar10;
  int iVar11;
  REF_DBL *scalar;
  REF_DBL *grad;
  ulong uVar12;
  int iVar13;
  REF_DBL *pRVar14;
  undefined8 uVar15;
  undefined4 *puVar16;
  REF_INT cell;
  ulong uVar17;
  undefined1 *puVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  REF_DBL cell_vol;
  REF_DBL *xyzs [4];
  REF_DBL flux_grad [3];
  REF_INT nodes [27];
  REF_DBL tet_flux [4];
  REF_DBL macro_flux [10];
  REF_DBL macro_xyz [10] [3];
  long local_2c0;
  double local_250;
  REF_DBL *local_248 [4];
  REF_DBL local_228 [4];
  REF_INT local_208 [28];
  REF_DBL local_198 [4];
  REF_DBL aRStack_178 [4];
  double adStack_158 [6];
  REF_DBL local_128 [12];
  undefined1 local_c8 [152];
  
  ref_node = ref_grid->node;
  iVar1 = ref_node->max;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x233,
           "ref_phys_cc_fv_embed","malloc direqu of REF_DBL negative");
    RVar10 = 1;
  }
  else {
    ref_cell = ref_grid->cell[8];
    scalar = (REF_DBL *)malloc((long)iVar1 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar21 = "malloc direqu of REF_DBL NULL";
      uVar15 = 0x233;
    }
    else {
      grad = (REF_DBL *)malloc((ulong)(uint)(iVar1 * 3) << 3);
      if (grad != (REF_DBL *)0x0) {
        iVar1 = nequ * 3;
        iVar11 = 0;
        local_2c0 = 0;
        do {
          if (0 < nequ) {
            iVar24 = 0;
            iVar22 = iVar11;
            do {
              iVar9 = ref_node->max;
              if (0 < (long)iVar9) {
                pRVar5 = ref_node->global;
                lVar19 = 0;
                iVar13 = iVar22;
                do {
                  if (-1 < pRVar5[lVar19]) {
                    scalar[lVar19] = flux[iVar13];
                  }
                  lVar19 = lVar19 + 1;
                  iVar13 = iVar13 + iVar1;
                } while (iVar9 != lVar19);
              }
              uVar8 = ref_recon_gradient(ref_grid,scalar,grad,REF_RECON_L2PROJECTION);
              if (uVar8 != 0) {
                pcVar21 = "grad";
                uVar15 = 0x23b;
                goto LAB_001b1bf8;
              }
              if (0 < ref_cell->max) {
                iVar9 = (int)local_2c0 * nequ + iVar24;
                cell = 0;
                do {
                  RVar10 = ref_cell_nodes(ref_cell,cell,local_208);
                  if (RVar10 == 0) {
                    iVar13 = ref_cell->node_per;
                    uVar12 = (ulong)iVar13;
                    if (0 < (long)uVar12) {
                      pRVar6 = ref_node->real;
                      pRVar14 = local_128;
                      uVar17 = 0;
                      do {
                        iVar2 = local_208[uVar17];
                        lVar19 = 0;
                        do {
                          pRVar14[lVar19] = pRVar6[(long)iVar2 * 0xf + lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 3);
                        uVar17 = uVar17 + 1;
                        pRVar14 = pRVar14 + 3;
                      } while (uVar17 != uVar12);
                    }
                    iVar2 = ref_cell->edge_per;
                    lVar19 = (long)iVar2;
                    if (0 < lVar19) {
                      pRVar7 = ref_cell->e2n;
                      pRVar14 = ref_node->real;
                      puVar18 = local_c8;
                      lVar20 = 0;
                      do {
                        iVar3 = local_208[pRVar7[lVar20 * 2]];
                        iVar4 = local_208[pRVar7[lVar20 * 2 + 1]];
                        lVar23 = 0;
                        do {
                          *(double *)(puVar18 + lVar23 * 8) =
                               (pRVar14[(long)iVar3 * 0xf + lVar23] +
                               pRVar14[(long)iVar4 * 0xf + lVar23]) * 0.5;
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        lVar20 = lVar20 + 1;
                        puVar18 = puVar18 + 0x18;
                      } while (lVar20 != lVar19);
                    }
                    if (0 < iVar13) {
                      uVar17 = 0;
                      do {
                        aRStack_178[uVar17] =
                             flux[(local_208[uVar17] * 3 + (int)local_2c0) * nequ + iVar24];
                        uVar17 = uVar17 + 1;
                      } while (uVar12 != uVar17);
                    }
                    if (0 < iVar2) {
                      pRVar7 = ref_cell->e2n;
                      pRVar14 = ref_node->real;
                      lVar20 = 0;
                      do {
                        iVar13 = local_208[pRVar7[lVar20 * 2]];
                        iVar2 = local_208[pRVar7[lVar20 * 2 + 1]];
                        dVar25 = 0.0;
                        dVar26 = 0.0;
                        lVar23 = 0;
                        do {
                          dVar27 = pRVar14[(long)iVar2 * 0xf + lVar23] -
                                   pRVar14[(long)iVar13 * 0xf + lVar23];
                          dVar25 = dVar25 + grad[(long)iVar2 * 3 + lVar23] * dVar27;
                          dVar26 = dVar26 + grad[(long)iVar13 * 3 + lVar23] * dVar27;
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        adStack_158[lVar20] =
                             (dVar26 - dVar25) * 0.125 +
                             (flux[iVar13 * iVar1 + iVar9] + flux[iVar2 * iVar1 + iVar9]) * 0.5;
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != lVar19);
                    }
                    puVar16 = &DAT_00220560;
                    lVar19 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar17 = 0;
                        do {
                          iVar13 = puVar16[uVar17];
                          local_248[uVar17] = local_128 + (long)iVar13 * 3;
                          local_198[uVar17] = aRStack_178[iVar13];
                          uVar17 = uVar17 + 1;
                        } while ((uVar12 & 0xffffffff) != uVar17);
                      }
                      uVar8 = ref_node_xyz_vol(local_248,&local_250);
                      if (uVar8 != 0) {
                        pcVar21 = "vol";
                        uVar15 = 0x267;
                        goto LAB_001b1bf8;
                      }
                      uVar8 = ref_node_xyz_grad(local_248,local_198,local_228);
                      if (uVar8 != 0) {
                        pcVar21 = "grad";
                        uVar15 = 0x268;
                        goto LAB_001b1bf8;
                      }
                      uVar12 = (ulong)ref_cell->node_per;
                      if (0 < (long)uVar12) {
                        dVar25 = local_228[local_2c0];
                        uVar17 = 0;
                        do {
                          iVar13 = local_208[uVar17] * nequ + iVar24;
                          res[iVar13] = res[iVar13] + dVar25 * 0.25 * local_250;
                          uVar17 = uVar17 + 1;
                        } while (uVar12 != uVar17);
                      }
                      lVar19 = lVar19 + 1;
                      puVar16 = puVar16 + 4;
                    } while (lVar19 != 8);
                  }
                  cell = cell + 1;
                } while (cell < ref_cell->max);
              }
              iVar24 = iVar24 + 1;
              iVar22 = iVar22 + 1;
            } while (iVar24 != nequ);
          }
          local_2c0 = local_2c0 + 1;
          iVar11 = iVar11 + nequ;
          if (local_2c0 == 3) {
            free(grad);
            free(scalar);
            uVar8 = ref_node_ghost_dbl(ref_node,res,nequ);
            if (uVar8 == 0) {
              return 0;
            }
            pcVar21 = "ghost res";
            uVar15 = 0x275;
LAB_001b1bf8:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar15,"ref_phys_cc_fv_embed",(ulong)uVar8,pcVar21);
            return uVar8;
          }
        } while( true );
      }
      pcVar21 = "malloc fluxgrad of REF_DBL NULL";
      uVar15 = 0x234;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar15,
           "ref_phys_cc_fv_embed",pcVar21);
    RVar10 = 2;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid, REF_INT nequ,
                                        REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, equ, dir, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];
  REF_DBL macro_flux[10], macro_xyz[10][3];
  REF_INT m2n[8][4] = {{0, 4, 5, 6}, {1, 8, 7, 4}, {2, 7, 9, 6}, {3, 6, 9, 8},
                       {4, 6, 9, 5}, {7, 8, 9, 4}, {7, 9, 5, 4}, {8, 6, 9, 4}};
  REF_INT n0, n1, macro;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT node;
  REF_DBL sdot0, sdot1, *direqu, *fluxgrad;
  REF_BOOL high_order = REF_TRUE;
  /* macro node [edge]
                                  3------9[5]--------2
                                 / \              . /
                                /   \          .   /
                               /     \      .     /
                              /       \  .       /
                             /        .\        /
                          6[2]   5[1]  8[4]   7[3]
                           /    .        \    /
                          /  .            \  /
                         /.                \/
                        0------4[0]--------1
  */

  ref_malloc(direqu, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(fluxgrad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (dir = 0; dir < 3; dir++) {
    for (equ = 0; equ < nequ; equ++) {
      each_ref_node_valid_node(ref_node, node) {
        direqu[node] = flux[equ + dir * nequ + 3 * nequ * node];
      }
      RSS(ref_recon_gradient(ref_grid, direqu, fluxgrad, recon), "grad");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          for (i = 0; i < 3; i++) {
            macro_xyz[cell_node][i] =
                ref_node_xyz(ref_node, i, nodes[cell_node]);
          }
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          for (i = 0; i < 3; i++) {
            macro_xyz[4 + cell_edge][i] = 0.5 * (ref_node_xyz(ref_node, i, n0) +
                                                 ref_node_xyz(ref_node, i, n1));
          }
        }

        each_ref_cell_cell_node(ref_cell, cell_node) {
          i = equ + dir * nequ + 3 * nequ * nodes[cell_node];
          macro_flux[cell_node] = flux[i];
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          macro_flux[4 + cell_edge] =
              0.5 * (flux[equ + dir * nequ + 3 * nequ * n0] +
                     flux[equ + dir * nequ + 3 * nequ * n1]);
          sdot0 = 0.0;
          sdot1 = 0.0;
          for (i = 0; i < 3; i++) {
            sdot0 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n0];
            sdot1 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n1];
          }
          if (high_order) macro_flux[4 + cell_edge] += 0.125 * (sdot0 - sdot1);
        }
        for (macro = 0; macro < 8; macro++) {
          each_ref_cell_cell_node(ref_cell, cell_node) {
            xyzs[cell_node] = macro_xyz[m2n[macro][cell_node]];
            tet_flux[cell_node] = macro_flux[m2n[macro][cell_node]];
          }
          RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
          RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            res[equ + nequ * nodes[cell_node]] +=
                0.25 * flux_grad[dir] * cell_vol;
          }
        }
      }
    }
  }

  ref_free(fluxgrad);
  ref_free(direqu);

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}